

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O0

int X509_REQ_get_attr_by_OBJ(X509_REQ *req,ASN1_OBJECT *obj,int lastpos)

{
  int iVar1;
  size_t sVar2;
  X509_ATTRIBUTE *pXVar3;
  X509_ATTRIBUTE *attr;
  int n;
  int lastpos_local;
  ASN1_OBJECT *obj_local;
  X509_REQ *req_local;
  
  if (req->req_info->attributes != (stack_st_X509_ATTRIBUTE *)0x0) {
    attr._4_4_ = lastpos + 1;
    if (attr._4_4_ < 0) {
      attr._4_4_ = 0;
    }
    sVar2 = sk_X509_ATTRIBUTE_num((stack_st_X509_ATTRIBUTE *)req->req_info->attributes);
    for (; attr._4_4_ < (int)sVar2; attr._4_4_ = attr._4_4_ + 1) {
      pXVar3 = sk_X509_ATTRIBUTE_value
                         ((stack_st_X509_ATTRIBUTE *)req->req_info->attributes,(long)attr._4_4_);
      iVar1 = OBJ_cmp((ASN1_OBJECT *)pXVar3->object,obj);
      if (iVar1 == 0) {
        return attr._4_4_;
      }
    }
  }
  return -1;
}

Assistant:

int X509_REQ_get_attr_by_OBJ(const X509_REQ *req, const ASN1_OBJECT *obj,
                             int lastpos) {
  if (req->req_info->attributes == NULL) {
    return -1;
  }
  lastpos++;
  if (lastpos < 0) {
    lastpos = 0;
  }
  int n = (int)sk_X509_ATTRIBUTE_num(req->req_info->attributes);
  for (; lastpos < n; lastpos++) {
    const X509_ATTRIBUTE *attr =
        sk_X509_ATTRIBUTE_value(req->req_info->attributes, lastpos);
    if (OBJ_cmp(attr->object, obj) == 0) {
      return lastpos;
    }
  }
  return -1;
}